

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

Variable __thiscall
runtime::VirtualMachine::loadClosureValue(VirtualMachine *this,Function *fn,size_t index)

{
  StackFrame *pSVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  Variable VVar4;
  string local_38;
  allocator<char> local_11;
  
  if ((ulong)((long)(fn->captures).
                    super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(fn->captures).
                    super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) <= index) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Index out of bounds in loadClosureValue",&local_11);
    panic(this,&local_38);
  }
  pvVar2 = std::vector<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>::at
                     (&fn->captures,index);
  pSVar1 = pvVar2->stackFrame;
  if (pvVar2->scopeIndex <
      (ulong)((long)(pSVar1->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pSVar1->locals).
                    super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    pvVar3 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                       (&pSVar1->locals,pvVar2->scopeIndex);
    VVar4._4_4_ = 0;
    VVar4.type = pvVar3->type;
    VVar4.field_1.integerValue = (pvVar3->field_1).integerValue;
    return VVar4;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Scope index >= closure.stackFrame->locals.size()",&local_11);
  panic(this,&local_38);
}

Assistant:

runtime::Variable runtime::VirtualMachine::loadClosureValue(const runtime::Function* fn, std::size_t index) {
  auto& closures = fn->captures;

  if (index >= closures.size()) {
    this->panic("Index out of bounds in loadClosureValue");
  }

  const auto& closure = closures.at(index);

  if (closure.scopeIndex >= closure.stackFrame->locals.size()) {
    this->panic("Scope index >= closure.stackFrame->locals.size()");
  }

  return closure.stackFrame->locals.at(closure.scopeIndex);
}